

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonParseAddNodeExpand(JsonParse *pParse,u32 eType,u32 n,char *zContent)

{
  uint uVar1;
  int iVar2;
  JsonNode *pJVar3;
  
  if (pParse->oom == '\0') {
    uVar1 = pParse->nAlloc * 2 + 10;
    pJVar3 = pParse->aNode;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pJVar3 = (JsonNode *)sqlite3Realloc(pJVar3,(ulong)uVar1 << 4);
    }
    else {
      pJVar3 = (JsonNode *)0x0;
    }
    if (pJVar3 != (JsonNode *)0x0) {
      pParse->nAlloc = uVar1;
      pParse->aNode = pJVar3;
      iVar2 = jsonParseAddNode(pParse,eType,n,zContent);
      return iVar2;
    }
    pParse->oom = '\x01';
  }
  return -1;
}

Assistant:

static JSON_NOINLINE int jsonParseAddNodeExpand(
  JsonParse *pParse,        /* Append the node to this object */
  u32 eType,                /* Node type */
  u32 n,                    /* Content size or sub-node count */
  const char *zContent      /* Content */
){
  u32 nNew;
  JsonNode *pNew;
  assert( pParse->nNode>=pParse->nAlloc );
  if( pParse->oom ) return -1;
  nNew = pParse->nAlloc*2 + 10;
  pNew = sqlite3_realloc64(pParse->aNode, sizeof(JsonNode)*nNew);
  if( pNew==0 ){
    pParse->oom = 1;
    return -1;
  }
  pParse->nAlloc = nNew;
  pParse->aNode = pNew;
  assert( pParse->nNode<pParse->nAlloc );
  return jsonParseAddNode(pParse, eType, n, zContent);
}